

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hh
# Opt level: O1

void __thiscall
Variant<int,std::__cxx11::string,char_const*>::move0<char_const*>
          (Variant<int,std::__cxx11::string,char_const*> *this,type_index *old_t,void *old_v,
          void *new_v)

{
  char *__s1;
  int iVar1;
  
  __s1 = *(char **)(old_t->_M_target + 8);
  if (__s1 != _vtable) {
    if (*__s1 == '*') {
      return;
    }
    iVar1 = strcmp(__s1,_vtable);
    if (iVar1 != 0) {
      return;
    }
  }
  *(undefined8 *)new_v = *old_v;
  return;
}

Assistant:

void move0(const std::type_index& old_t, void *old_v, void *new_v)
	{
		if (old_t == std::type_index(typeid(T)))
			new (new_v)T(std::move(*reinterpret_cast<T*>(old_v)));
	}